

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error ft_glyphslot_init(FT_GlyphSlot slot)

{
  FT_Memory aloader;
  FT_Slot_Internal internal;
  FT_Memory pFStack_28;
  FT_Error error;
  FT_Memory memory;
  FT_Driver_Class clazz;
  FT_Driver driver;
  FT_GlyphSlot slot_local;
  
  clazz = (FT_Driver_Class)slot->face->driver;
  memory = (FT_Memory)(clazz->root).module_version;
  pFStack_28 = (FT_Memory)(clazz->root).module_name;
  internal._4_4_ = 0;
  slot->library = (FT_Library)(clazz->root).module_size;
  driver = (FT_Driver)slot;
  aloader = (FT_Memory)ft_mem_alloc(pFStack_28,0x48,(FT_Error *)((long)&internal + 4));
  if (internal._4_4_ == 0) {
    driver[5].root.memory = aloader;
    if ((*(ulong *)(clazz->root).module_flags & 0x200) == 0) {
      internal._4_4_ = FT_GlyphLoader_New(pFStack_28,(FT_GlyphLoader *)aloader);
    }
    if ((internal._4_4_ == 0) && (memory[4].user != (void *)0x0)) {
      internal._4_4_ = (*(code *)memory[4].user)(driver);
    }
  }
  return internal._4_4_;
}

Assistant:

static FT_Error
  ft_glyphslot_init( FT_GlyphSlot  slot )
  {
    FT_Driver         driver   = slot->face->driver;
    FT_Driver_Class   clazz    = driver->clazz;
    FT_Memory         memory   = driver->root.memory;
    FT_Error          error    = FT_Err_Ok;
    FT_Slot_Internal  internal = NULL;


    slot->library = driver->root.library;

    if ( FT_NEW( internal ) )
      goto Exit;

    slot->internal = internal;

    if ( FT_DRIVER_USES_OUTLINES( driver ) )
      error = FT_GlyphLoader_New( memory, &internal->loader );

    if ( !error && clazz->init_slot )
      error = clazz->init_slot( slot );

  Exit:
    return error;
  }